

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O2

void * Abc_NodeGetCutsRecursive(void *p,Abc_Obj_t *pObj,int fDag,int fTree)

{
  void *pvVar1;
  
  pvVar1 = Abc_NodeReadCuts(p,pObj);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  Abc_NodeGetCutsRecursive
            (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],fDag,fTree);
  Abc_NodeGetCutsRecursive
            (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]],fDag,fTree);
  pvVar1 = Abc_NodeGetCuts(p,pObj,fDag,fTree);
  return pvVar1;
}

Assistant:

void * Abc_NodeGetCutsRecursive( void * p, Abc_Obj_t * pObj, int fDag, int fTree )
{
    void * pList;
    if ( (pList = Abc_NodeReadCuts( p, pObj )) )
        return pList;
    Abc_NodeGetCutsRecursive( p, Abc_ObjFanin0(pObj), fDag, fTree );
    Abc_NodeGetCutsRecursive( p, Abc_ObjFanin1(pObj), fDag, fTree );
    return Abc_NodeGetCuts( p, pObj, fDag, fTree );
}